

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

void enet_host_compress(ENetHost *host,ENetCompressor *compressor)

{
  undefined8 *in_RSI;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0xad8) != 0) && (*(long *)(in_RDI + 0xaf0) != 0)) {
    (**(code **)(in_RDI + 0xaf0))(*(undefined8 *)(in_RDI + 0xad8));
  }
  if (in_RSI == (undefined8 *)0x0) {
    *(undefined8 *)(in_RDI + 0xad8) = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0xad8) = *in_RSI;
    *(undefined8 *)(in_RDI + 0xae0) = in_RSI[1];
    *(undefined8 *)(in_RDI + 0xae8) = in_RSI[2];
    *(undefined8 *)(in_RDI + 0xaf0) = in_RSI[3];
  }
  return;
}

Assistant:

void
enet_host_compress (ENetHost * host, const ENetCompressor * compressor)
{
    if (host -> compressor.context != NULL && host -> compressor.destroy)
      (* host -> compressor.destroy) (host -> compressor.context);

    if (compressor)
      host -> compressor = * compressor;
    else
      host -> compressor.context = NULL;
}